

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_perform(CURL *easy)

{
  int iVar1;
  bool bVar2;
  CURLMcode CVar3;
  CURLMcode CVar4;
  Curl_multi *multi_handle;
  long lVar5;
  CURLMsg *pCVar6;
  CURLcode CVar7;
  int timeout_ms;
  _Bool done;
  bool bVar8;
  timeval older;
  timeval newer;
  int still_running;
  int ret;
  CURLcode local_4c;
  int local_48;
  int local_44;
  ulong local_40;
  int local_34;
  
  if (easy == (CURL *)0x0) {
    CVar7 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if (*(long *)((long)easy + 0x60) == 0) {
    multi_handle = *(Curl_multi **)((long)easy + 0x68);
    if (multi_handle == (Curl_multi *)0x0) {
      multi_handle = Curl_multi_handle(1,3);
      if (multi_handle == (Curl_multi *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      *(Curl_multi **)((long)easy + 0x68) = multi_handle;
    }
    curl_multi_setopt(multi_handle,CURLMOPT_MAXCONNECTS,*(undefined8 *)((long)easy + 0x6a8));
    CVar3 = curl_multi_add_handle(multi_handle,easy);
    if (CVar3 == CURLM_OK) {
      local_40 = 0;
      *(Curl_multi **)((long)easy + 0x60) = multi_handle;
      local_4c = CURLE_OK;
      CVar3 = CURLM_OK;
      bVar8 = false;
      do {
        if ((CVar3 != CURLM_OK) || (bVar8)) break;
        local_48 = 0;
        older = curlx_tvnow();
        CVar3 = curl_multi_wait(multi_handle,(curl_waitfd *)0x0,0,1000,&local_44);
        if (CVar3 == CURLM_OK) {
          CVar3 = CURLM_OK;
          if (local_44 != -1) {
            if (local_44 == 0) {
              newer = curlx_tvnow();
              lVar5 = curlx_tvdiff(newer,older);
              if (lVar5 < 0xb) {
                iVar1 = (int)local_40;
                CVar3 = iVar1 + CURLM_BAD_HANDLE;
                if (1 < iVar1) {
                  timeout_ms = 1 << ((byte)local_40 & 0x1f);
                  if (8 < iVar1) {
                    timeout_ms = 1000;
                  }
                  Curl_wait_ms(timeout_ms);
                }
              }
            }
            CVar4 = curl_multi_perform(multi_handle,&local_48);
            local_40 = (ulong)(uint)CVar3;
            CVar3 = CVar4;
            goto LAB_00564cb7;
          }
          local_4c = CURLE_RECV_ERROR;
          bVar2 = false;
        }
        else {
LAB_00564cb7:
          bVar2 = true;
          if ((local_48 == 0 && CVar3 == CURLM_OK) &&
             (pCVar6 = curl_multi_info_read(multi_handle,&local_34), pCVar6 != (CURLMsg *)0x0)) {
            local_4c = (pCVar6->data).result;
            bVar8 = true;
          }
        }
      } while (bVar2);
      CVar7 = (uint)(CVar3 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
      if (CVar3 == CURLM_OK) {
        CVar7 = local_4c;
      }
      curl_multi_remove_handle(multi_handle,easy);
    }
    else {
      curl_multi_cleanup(multi_handle);
      CVar7 = CURLE_FAILED_INIT;
      if (CVar3 == CURLM_OUT_OF_MEMORY) {
        CVar7 = CURLE_OUT_OF_MEMORY;
      }
    }
  }
  else {
    Curl_failf((SessionHandle *)easy,"easy handle already used in multi handle");
    CVar7 = CURLE_FAILED_INIT;
  }
  return CVar7;
}

Assistant:

static CURLcode easy_perform(struct SessionHandle *data, bool events)
{
  CURLM *multi;
  CURLMcode mcode;
  CURLcode result = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    else
      return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* assign this after curl_multi_add_handle() since that function checks for
     it and rejects this handle otherwise */
  data->multi = multi;

  /* run the transfer */
  result = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return result;
}